

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,SizeRange *range)

{
  uint64 val;
  RangeValue local_50;
  RangeValue local_40;
  size_t local_30;
  int64_t max;
  size_t local_20;
  SizeRange *local_18;
  SizeRange *range_local;
  ShapeRange *this_local;
  
  local_18 = range;
  range_local = (SizeRange *)this;
  RangeValue::RangeValue(&this->_minimum);
  RangeValue::RangeValue(&this->_maximum);
  val = Specification::SizeRange::lowerbound(local_18);
  RangeValue::RangeValue((RangeValue *)&max,val);
  *(int64_t *)&this->_minimum = max;
  (this->_minimum)._val = local_20;
  local_30 = Specification::SizeRange::upperbound(local_18);
  if ((long)local_30 < 0) {
    RangeValue::RangeValue(&local_40);
    (this->_maximum)._isUnbound = local_40._isUnbound;
    *(undefined7 *)&(this->_maximum).field_0x1 = local_40._1_7_;
    (this->_maximum)._val = local_40._val;
  }
  else {
    RangeValue::RangeValue(&local_50,local_30);
    (this->_maximum)._isUnbound = local_50._isUnbound;
    *(undefined7 *)&(this->_maximum).field_0x1 = local_50._1_7_;
    (this->_maximum)._val = local_50._val;
  }
  return;
}

Assistant:

ShapeRange::ShapeRange(const Specification::SizeRange& range) {
    _minimum = static_cast<size_t>(range.lowerbound());
    int64_t max = range.upperbound();
    if (max < 0) {
        _maximum = RangeValue();
    }
    else {
        _maximum = static_cast<size_t>(max);
    }
}